

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O0

copy_ptr<cppcms::xss::rules::data> * __thiscall
booster::copy_ptr<cppcms::xss::rules::data>::operator=
          (copy_ptr<cppcms::xss::rules::data> *this,copy_ptr<cppcms::xss::rules::data> *other)

{
  copy_ptr<cppcms::xss::rules::data> *in_RSI;
  copy_ptr<cppcms::xss::rules::data> *in_RDI;
  copy_ptr<cppcms::xss::rules::data> *in_stack_00000008;
  copy_ptr<cppcms::xss::rules::data> tmp;
  copy_ptr<cppcms::xss::rules::data> local_18 [3];
  
  if (in_RDI != in_RSI) {
    copy_ptr((copy_ptr<cppcms::xss::rules::data> *)tmp.ptr_,in_stack_00000008);
    swap(in_RDI,local_18);
    ~copy_ptr(in_RDI);
  }
  return in_RDI;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}